

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectProgramInterfaceiv
          (FunctionalTest3_4 *this,GLuint program_id)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  inspectionDetailsForProgramInterface details [5];
  GLenum aGStack_70 [8];
  undefined8 local_50;
  GLint local_48;
  undefined8 local_44;
  GLint local_3c;
  undefined8 local_38;
  int local_30;
  
  aGStack_70[2] = 0x92ee;
  aGStack_70[3] = 0x92f5;
  aGStack_70[4] = this->m_n_active_subroutine_uniforms;
  aGStack_70[5] = 0x92ee;
  aGStack_70[6] = 0x92f6;
  aGStack_70[7] = this->m_n_active_subroutine_uniform_name_length + 1;
  local_50 = 0x92f8000092ee;
  local_48 = this->m_n_active_subroutines;
  local_44 = 0x92f5000092e8;
  local_3c = this->m_n_active_subroutines;
  local_38 = 0x92f6000092e8;
  local_30 = this->m_n_active_subroutine_name_length + 1;
  bVar2 = true;
  lVar3 = 8;
  do {
    aGStack_70[0] = 0x97b932;
    aGStack_70[1] = 0;
    bVar1 = checkProgramInterfaceiv
                      (this,program_id,*(GLenum *)((long)aGStack_70 + lVar3),
                       *(GLenum *)((long)aGStack_70 + lVar3 + 4),
                       *(GLint *)((long)aGStack_70 + lVar3 + 8));
    if (!bVar1) {
      bVar2 = false;
    }
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0x44);
  return bVar2;
}

Assistant:

bool FunctionalTest3_4::inspectProgramInterfaceiv(glw::GLuint program_id) const
{
	bool result = true;

	const inspectionDetailsForProgramInterface details[] = {
		{ GL_VERTEX_SUBROUTINE_UNIFORM, GL_ACTIVE_RESOURCES, m_n_active_subroutine_uniforms },
		{ GL_VERTEX_SUBROUTINE_UNIFORM, GL_MAX_NAME_LENGTH, m_n_active_subroutine_uniform_name_length + 1 },
		{ GL_VERTEX_SUBROUTINE_UNIFORM, GL_MAX_NUM_COMPATIBLE_SUBROUTINES, m_n_active_subroutines },
		{ GL_VERTEX_SUBROUTINE, GL_ACTIVE_RESOURCES, m_n_active_subroutines },
		{ GL_VERTEX_SUBROUTINE, GL_MAX_NAME_LENGTH, m_n_active_subroutine_name_length + 1 }
	};
	const GLuint n_details = sizeof(details) / sizeof(details[0]);

	for (GLuint i = 0; i < n_details; ++i)
	{
		if (false == checkProgramInterfaceiv(program_id, details[i].program_interface, details[i].pname,
											 details[i].expected_value))
		{
			result = false;
		}
	}

	return result;
}